

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

void evutil_rtrim_lws_(char *str)

{
  bool bVar1;
  char *local_18;
  char *cp;
  char *str_local;
  
  if ((str != (char *)0x0) && (local_18 = strchr(str,0), local_18 != (char *)0x0)) {
    while (local_18 != str) {
      local_18 = local_18 + -1;
      bVar1 = true;
      if (*local_18 != ' ') {
        bVar1 = *local_18 == '\t';
      }
      if (!bVar1) {
        return;
      }
      *local_18 = '\0';
    }
  }
  return;
}

Assistant:

void
evutil_rtrim_lws_(char *str)
{
	char *cp;

	if (str == NULL)
		return;

	if ((cp = strchr(str, '\0')) == NULL || (cp == str))
		return;

	--cp;

	while (*cp == ' ' || *cp == '\t') {
		*cp = '\0';
		if (cp == str)
			break;
		--cp;
	}
}